

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O1

asn_strtol_result_e asn_strtol_lim(char *str,char **end,long *lp)

{
  bool bVar1;
  asn_strtol_result_e aVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  
  aVar2 = ASN_STRTOL_ERROR_INVAL;
  if (str < *end) {
    uVar3 = 7;
    iVar6 = 1;
    if (*str != '+') {
      if (*str != '-') goto LAB_00140f8b;
      uVar3 = 8;
      iVar6 = -1;
    }
    str = str + 1;
    if (str < *end) {
LAB_00140f8b:
      pbVar7 = (byte *)*end;
      if (str < pbVar7) {
        lVar5 = 0;
        do {
          if (9 < (byte)(*str - 0x30U)) {
            *end = str;
            *lp = lVar5 * iVar6;
            return ASN_STRTOL_EXTRA_DATA;
          }
          uVar8 = (byte)*str - 0x30;
          if (lVar5 < 0xccccccccccccccc) {
            lVar5 = (ulong)uVar8 + lVar5 * 10;
            bVar1 = true;
          }
          else if (lVar5 == 0xccccccccccccccc) {
            uVar4 = (ulong)uVar8;
            if (uVar3 < uVar4) {
              *end = str;
              bVar1 = false;
              lVar5 = 0xccccccccccccccc;
              pbVar7 = (byte *)str;
            }
            else if (iVar6 < 1) {
              lVar5 = -0x7ffffffffffffff8 - uVar4;
              bVar1 = true;
              iVar6 = 1;
            }
            else {
              lVar5 = uVar4 + 0x7ffffffffffffff8;
              bVar1 = true;
              iVar6 = 1;
            }
          }
          else {
            *end = str;
            bVar1 = false;
            pbVar7 = (byte *)str;
          }
          if (!bVar1) {
            return ASN_STRTOL_ERROR_RANGE;
          }
          str = (char *)((byte *)str + 1);
        } while (str < pbVar7);
      }
      else {
        lVar5 = 0;
      }
      *end = str;
      *lp = iVar6 * lVar5;
      return ASN_STRTOL_OK;
    }
    *end = str;
    aVar2 = ASN_STRTOL_EXPECT_MORE;
  }
  return aVar2;
}

Assistant:

enum asn_strtol_result_e
asn_strtol_lim(const char *str, const char **end, long *lp) {
	int sign = 1;
	long l;

	const long upper_boundary = LONG_MAX / 10;
	long last_digit_max = LONG_MAX % 10;

	if(str >= *end) return ASN_STRTOL_ERROR_INVAL;

	switch(*str) {
	case '-':
		last_digit_max++;
		sign = -1;
		/* FALL THROUGH */
	case '+':
		str++;
		if(str >= *end) {
			*end = str;
			return ASN_STRTOL_EXPECT_MORE;
		}
	}

	for(l = 0; str < (*end); str++) {
		switch(*str) {
		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34:
		case 0x35: case 0x36: case 0x37: case 0x38: case 0x39: {
			int d = *str - '0';
			if(l < upper_boundary) {
				l = l * 10 + d;
			} else if(l == upper_boundary) {
				if(d <= last_digit_max) {
					if(sign > 0) {
						l = l * 10 + d;
					} else {
						sign = 1;
						l = -l * 10 - d;
					}
				} else {
					*end = str;
					return ASN_STRTOL_ERROR_RANGE;
				}
			} else {
				*end = str;
				return ASN_STRTOL_ERROR_RANGE;
			}
		    }
		    continue;
		default:
		    *end = str;
		    *lp = sign * l;
		    return ASN_STRTOL_EXTRA_DATA;
		}
	}

	*end = str;
	*lp = sign * l;
	return ASN_STRTOL_OK;
}